

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 FormatMount(sxi32 nType,void *pConsumer,ProcConsumer xUserCons,void *pUserData,sxu32 *pOutLen,
                 char *zFormat,__va_list_tag *ap)

{
  byte bVar1;
  bool bVar2;
  double dVar3;
  double dVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  char *pcVar9;
  ushort uVar10;
  sxi32 sVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  ProcConsumer *pp_Var15;
  uint *puVar16;
  double *pdVar17;
  ulong *puVar18;
  undefined8 *puVar19;
  ulong uVar20;
  char cVar21;
  uint uVar22;
  ulong uVar23;
  byte *pbVar24;
  char cVar25;
  long lVar26;
  uint uVar27;
  int *piVar28;
  char *pcVar29;
  int nspace;
  long lVar30;
  char *pcVar31;
  ulong uVar32;
  char *pcVar33;
  int nspace_1;
  bool bVar34;
  sxu32 local_470;
  sxi32 local_46c;
  sxi32 local_468;
  ProcConsumer local_460;
  ProcConsumer local_458;
  sxu32 *local_450;
  double local_448;
  double local_440;
  char local_438 [1021];
  char local_3b;
  char local_3a [10];
  
  local_468 = 0;
  local_470 = 0;
  if (pOutLen != (sxu32 *)0x0) {
    *pOutLen = 0;
  }
  if (nType == 6) {
    pp_Var15 = &local_460;
    pUserData = pConsumer;
  }
  else {
    if (nType != 1) {
      return -0xd;
    }
    pp_Var15 = &local_458;
    local_460 = xUserCons;
  }
  *pp_Var15 = (ProcConsumer)pUserData;
  uVar23 = 0;
  pcVar29 = (char *)0x0;
  local_46c = nType;
  local_450 = pOutLen;
  while( true ) {
    pcVar31 = zFormat;
    if (*zFormat != '%') {
      if (*zFormat == '\0') goto LAB_001102d4;
      for (lVar30 = 1; (cVar25 = zFormat[lVar30], cVar25 != '\0' && (cVar25 != '%'));
          lVar30 = lVar30 + 1) {
      }
      sVar11 = FormatConsumer(zFormat,(uint)lVar30,&local_470);
      if ((cVar25 == '\0') || (sVar11 != 0)) goto LAB_001102d4;
      pcVar31 = zFormat + lVar30;
      pcVar29 = zFormat;
    }
    cVar25 = pcVar31[1];
    if (cVar25 == '\0') break;
    bVar8 = false;
    bVar2 = false;
    bVar5 = false;
    bVar6 = false;
    bVar7 = false;
    pcVar31 = pcVar31 + 2;
    do {
      pcVar33 = pcVar31;
      if (cVar25 == ' ') {
        bVar5 = true;
      }
      else if (cVar25 == '#') {
        bVar6 = true;
      }
      else if (cVar25 == '0') {
        bVar7 = true;
      }
      else if (cVar25 == '-') {
        bVar8 = true;
      }
      else {
        if (cVar25 != '+') {
          if (cVar25 != '*') {
            iVar12 = (int)cVar25;
            pcVar33 = pcVar33 + -1;
            goto LAB_0010f6e3;
          }
          uVar22 = ap->gp_offset;
          if ((ulong)uVar22 < 0x29) {
            puVar16 = (uint *)((ulong)uVar22 + (long)ap->reg_save_area);
            ap->gp_offset = uVar22 + 8;
          }
          else {
            puVar16 = (uint *)ap->overflow_arg_area;
            ap->overflow_arg_area = puVar16 + 2;
          }
          uVar22 = *puVar16;
          uVar27 = -uVar22;
          if (0 < (int)uVar22) {
            uVar27 = uVar22;
          }
          if ((int)uVar22 < 0) {
            bVar8 = true;
          }
          iVar12 = (int)*pcVar33;
          goto LAB_0010f75a;
        }
        bVar2 = true;
      }
      cVar25 = *pcVar33;
      pcVar31 = pcVar33 + 1;
    } while (cVar25 != '\0');
    iVar12 = 0;
LAB_0010f6e3:
    uVar27 = 0;
    while (iVar12 - 0x30U < 10) {
      uVar27 = (iVar12 - 0x30U) + uVar27 * 10;
      pcVar31 = pcVar33 + 1;
      pcVar33 = pcVar33 + 1;
      iVar12 = (int)*pcVar31;
    }
LAB_0010f75a:
    if (0x3f5 < (int)uVar27) {
      uVar27 = 0x3f6;
    }
    if (iVar12 == 0x2e) {
      cVar25 = pcVar33[1];
      if (cVar25 == '*') {
        uVar22 = ap->gp_offset;
        if ((ulong)uVar22 < 0x29) {
          puVar16 = (uint *)((ulong)uVar22 + (long)ap->reg_save_area);
          ap->gp_offset = uVar22 + 8;
        }
        else {
          puVar16 = (uint *)ap->overflow_arg_area;
          ap->overflow_arg_area = puVar16 + 2;
        }
        uVar22 = *puVar16;
        uVar14 = -uVar22;
        if (0 < (int)uVar22) {
          uVar14 = uVar22;
        }
        uVar32 = (ulong)uVar14;
        iVar12 = (int)pcVar33[2];
        pcVar33 = pcVar33 + 2;
      }
      else {
        uVar32 = 0;
        pcVar31 = pcVar33;
        while( true ) {
          pcVar33 = pcVar31 + 1;
          iVar12 = (int)cVar25;
          if (9 < (byte)(cVar25 - 0x30U)) break;
          uVar32 = (ulong)(((int)uVar32 * 10 + iVar12) - 0x30);
          cVar25 = pcVar31[2];
          pcVar31 = pcVar33;
        }
      }
    }
    else {
      uVar32 = 0xffffffffffffffff;
    }
    if ((iVar12 == 0x71) || (cVar25 = '\0', iVar12 == 0x6c)) {
      bVar34 = iVar12 == 0x71;
      iVar12 = (int)pcVar33[1];
      pcVar33 = pcVar33 + 1;
      cVar25 = (iVar12 == 0x6c || bVar34) + '\x01';
    }
    lVar30 = -0x1f;
    do {
      lVar26 = lVar30;
      if (lVar26 + 0x20 == 0x241) goto switchD_0010f865_caseD_9;
      lVar30 = lVar26 + 0x20;
    } while (iVar12 != (char)(&UNK_0015029f)[lVar26]);
    cVar21 = (&UNK_001502a7)[lVar26];
    uVar22 = (uint)uVar32;
    switch(cVar21) {
    case '\x01':
      if (cVar25 == '\0') {
        uVar14 = ap->gp_offset;
        if (((&UNK_001502a3)[lVar26] & 1) == 0) {
          if (uVar14 < 0x29) {
            puVar16 = (uint *)((ulong)uVar14 + (long)ap->reg_save_area);
            ap->gp_offset = uVar14 + 8;
          }
          else {
            puVar16 = (uint *)ap->overflow_arg_area;
            ap->overflow_arg_area = puVar16 + 2;
          }
          uVar23 = (ulong)*puVar16;
        }
        else {
          if (uVar14 < 0x29) {
            piVar28 = (int *)((ulong)uVar14 + (long)ap->reg_save_area);
            ap->gp_offset = uVar14 + 8;
          }
          else {
            piVar28 = (int *)ap->overflow_arg_area;
            ap->overflow_arg_area = piVar28 + 2;
          }
          uVar23 = (ulong)*piVar28;
        }
      }
      else {
        uVar14 = ap->gp_offset;
        if ((ulong)uVar14 < 0x29) {
          puVar18 = (ulong *)((ulong)uVar14 + (long)ap->reg_save_area);
          ap->gp_offset = uVar14 + 8;
        }
        else {
          puVar18 = (ulong *)ap->overflow_arg_area;
          ap->overflow_arg_area = puVar18 + 1;
        }
        uVar23 = *puVar18;
      }
      if (0x3d7 < (int)uVar22) {
        uVar22 = 0x3d8;
      }
      uVar32 = uVar23;
      if (((&UNK_001502a3)[lVar26] & 1) == 0) {
        uVar32 = -uVar23;
        if (0 < (long)uVar23) {
          uVar32 = uVar23;
        }
        bVar5 = true;
        iVar12 = 0;
        cVar25 = '\0';
      }
      else {
        if ((long)uVar23 < 0) {
          uVar32 = -uVar23;
          cVar25 = '-';
        }
        else {
          if (!bVar2) {
            bVar5 = !bVar5;
            iVar12 = -(uint)!bVar5;
            cVar25 = !bVar5 << 5;
            goto LAB_001101bd;
          }
          cVar25 = '+';
        }
        bVar5 = false;
        iVar12 = -1;
      }
LAB_001101bd:
      lVar30 = *(long *)(&UNK_001502af + lVar26);
      bVar1 = (&DAT_001502a0)[lVar26];
      iVar13 = 0;
      pcVar31 = local_3a + 1;
      pcVar9 = &local_3b;
      do {
        pcVar29 = pcVar9;
        uVar20 = (long)uVar32 / (long)(ulong)bVar1;
        cVar21 = *(char *)(lVar30 + (long)uVar32 % (long)(ulong)bVar1);
        pcVar31[-1] = cVar21;
        pcVar31 = pcVar31 + -1;
        iVar13 = iVar13 + -1;
        uVar32 = uVar20;
        pcVar9 = pcVar29 + -1;
      } while (0 < (long)uVar20);
      uVar14 = iVar12 + uVar27;
      if ((int)(iVar12 + uVar27) < (int)uVar22) {
        uVar14 = uVar22;
      }
      if (!bVar7) {
        uVar14 = uVar22;
      }
      for (iVar13 = uVar14 + iVar13; 0 < iVar13; iVar13 = iVar13 + -1) {
        *pcVar29 = '0';
        pcVar29 = pcVar29 + -1;
        cVar21 = '0';
      }
      if (bVar5) {
        pcVar29 = pcVar29 + 1;
        cVar25 = cVar21;
      }
      else {
        *pcVar29 = cVar25;
      }
      if (((bVar6 && uVar23 != 0) &&
          (pcVar31 = *(char **)((long)&DAT_001502b0 + lVar26 + 7), pcVar31 != (char *)0x0)) &&
         (cVar21 = *pcVar31, cVar25 != cVar21)) {
        while (pcVar31 = pcVar31 + 1, cVar21 != '\0') {
          pcVar29[-1] = cVar21;
          pcVar29 = pcVar29 + -1;
          cVar21 = *pcVar31;
        }
      }
      uVar23 = (ulong)(uint)(((int)local_3a + 1) - (int)pcVar29);
      break;
    case '\x02':
    case '\x03':
    case '\x04':
      uVar14 = ap->fp_offset;
      if ((ulong)uVar14 < 0xa1) {
        pdVar17 = (double *)((ulong)uVar14 + (long)ap->reg_save_area);
        ap->fp_offset = uVar14 + 0x10;
      }
      else {
        pdVar17 = (double *)ap->overflow_arg_area;
        ap->overflow_arg_area = pdVar17 + 1;
      }
      local_440 = *pdVar17;
      uVar14 = 0x3d8;
      if ((int)uVar22 < 0x3d8) {
        uVar14 = uVar22;
      }
      if ((int)uVar22 < 0) {
        uVar14 = 6;
      }
      if (0.0 <= local_440) {
        dVar3 = local_440;
        if (bVar2) {
          cVar25 = '+';
          bVar5 = false;
          uVar32 = 1;
        }
        else {
          bVar5 = !bVar5;
          uVar32 = (ulong)!bVar5;
          cVar25 = !bVar5 << 5;
        }
      }
      else {
        cVar25 = '-';
        bVar5 = false;
        uVar32 = 1;
        dVar3 = -local_440;
      }
      local_448 = 0.5;
      iVar13 = uVar14 - (0 < (int)uVar14 && cVar21 == '\x04');
      for (iVar12 = iVar13; 0 < iVar12; iVar12 = iVar12 + -1) {
        local_448 = local_448 * 0.1;
      }
      if (cVar21 == '\x02') {
        dVar3 = dVar3 + local_448;
      }
      uVar23 = 0;
      if (0.0 < dVar3) {
        for (uVar23 = 0; (100000000.0 <= dVar3 && ((uint)uVar23 < 0x15f));
            uVar23 = (ulong)((uint)uVar23 + 8)) {
          dVar3 = dVar3 * 1e-08;
        }
        for (; (10.0 <= dVar3 && ((uint)uVar23 < 0x15f)); uVar23 = (ulong)((uint)uVar23 + 1)) {
          dVar3 = dVar3 * 0.1;
        }
        for (; (dVar3 < 1e-08 && (-0x15f < (int)uVar23)); uVar23 = (ulong)((int)uVar23 - 8)) {
          dVar3 = dVar3 * 100000000.0;
        }
        while ((iVar12 = (int)uVar23, dVar3 < 1.0 && (-0x15f < iVar12))) {
          dVar3 = dVar3 * 10.0;
          uVar23 = (ulong)(iVar12 - 1);
        }
        if (iVar12 - 0x15fU < 0xfffffd43) {
          uVar23 = 3;
          pcVar29 = "NaN";
          break;
        }
      }
      if (cVar21 == '\x02') {
        bVar2 = true;
        bVar34 = false;
LAB_0010fc38:
        if ((!bVar2) || (iVar12 = (int)uVar23, 0x3e1 < iVar13 + iVar12)) goto LAB_0010fcec;
        bVar2 = 0 < iVar13;
        pcVar31 = local_438;
        if (!bVar5) {
          local_438[0] = cVar25;
          pcVar31 = local_438 + 1;
        }
        if (iVar12 < 0) {
          *pcVar31 = '0';
          pcVar31 = pcVar31 + 1;
          iVar12 = iVar12 + 1;
          uVar22 = 0;
        }
        else {
          uVar22 = iVar12 + 1;
          for (lVar30 = 0; iVar12 + 1U != (uint)lVar30; lVar30 = lVar30 + 1) {
            cVar25 = '0';
            if ((uint)lVar30 < 0x10) {
              dVar4 = ROUND(dVar3);
              dVar3 = (dVar3 - (double)(int)dVar4) * 10.0;
              cVar25 = (char)(int)dVar4 + '0';
            }
            pcVar31[lVar30] = cVar25;
          }
          pcVar31 = pcVar31 + lVar30;
          iVar12 = 0;
        }
        if (bVar2 || bVar6) {
          *pcVar31 = '.';
          pcVar31 = pcVar31 + 1;
        }
        pcVar29 = pcVar31 + -1;
        for (; (iVar12 < 0 && (0 < iVar13)); iVar13 = iVar13 + -1) {
          *pcVar31 = '0';
          pcVar31 = pcVar31 + 1;
          iVar12 = iVar12 + 1;
          pcVar29 = pcVar29 + 1;
        }
        for (; 0 < iVar13; iVar13 = iVar13 + -1) {
          cVar25 = '0';
          if (uVar22 < 0x10) {
            dVar4 = ROUND(dVar3);
            dVar3 = (dVar3 - (double)(int)dVar4) * 10.0;
            cVar25 = (char)(int)dVar4 + '0';
          }
          pcVar29[1] = cVar25;
          pcVar29 = pcVar29 + 1;
          uVar22 = uVar22 + 1;
        }
        pcVar29[1] = '\0';
        if ((bool)(bVar34 & (bVar2 || bVar6))) {
          for (; local_438 <= pcVar29; pcVar29 = pcVar29 + -1) {
            if (*pcVar29 != '0') {
              if (*pcVar29 == '.') {
                *pcVar29 = '\0';
                pcVar29 = pcVar29 + -1;
              }
              break;
            }
            *pcVar29 = '\0';
          }
        }
LAB_001100fb:
        iVar12 = (int)pcVar29 + 1;
      }
      else {
        dVar4 = local_448 + dVar3;
        dVar3 = dVar4;
        if (dVar4 >= 10.0) {
          dVar3 = dVar4 * 0.1;
        }
        uVar22 = ((int)uVar23 + 1) - (uint)(dVar4 < 10.0);
        uVar23 = (ulong)uVar22;
        if (cVar21 == '\x04') {
          bVar34 = !bVar6;
          bVar2 = (int)uVar22 <= iVar13 && -5 < (int)uVar22;
          uVar14 = 0;
          if ((int)uVar22 <= iVar13 && -5 < (int)uVar22) {
            uVar14 = uVar22;
          }
          iVar13 = iVar13 - uVar14;
          goto LAB_0010fc38;
        }
        bVar34 = false;
LAB_0010fcec:
        bVar2 = 0 < iVar13;
        pcVar29 = local_438;
        if (!bVar5) {
          local_438[0] = cVar25;
          pcVar29 = local_438 + 1;
        }
        dVar4 = (dVar3 - (double)(int)ROUND(dVar3)) * 10.0;
        *pcVar29 = (char)(int)ROUND(dVar3) + '0';
        if (bVar2 || bVar6) {
          pcVar29[1] = '.';
          pcVar29 = pcVar29 + 2;
        }
        else {
          pcVar29 = pcVar29 + 1;
        }
        pcVar29 = pcVar29 + -1;
        uVar22 = 1;
        for (; 0 < iVar13; iVar13 = iVar13 + -1) {
          cVar25 = '0';
          if (uVar22 < 0x10) {
            dVar3 = ROUND(dVar4);
            dVar4 = (dVar4 - (double)(int)dVar3) * 10.0;
            cVar25 = (char)(int)dVar3 + '0';
          }
          pcVar29[1] = cVar25;
          pcVar29 = pcVar29 + 1;
          uVar22 = uVar22 + 1;
        }
        if ((bool)(bVar34 & (bVar2 || bVar6))) {
          for (; local_438 <= pcVar29; pcVar29 = pcVar29 + -1) {
            if (*pcVar29 != '0') {
              if (*pcVar29 == '.') {
                *pcVar29 = '\0';
                pcVar29 = pcVar29 + -1;
              }
              break;
            }
            *pcVar29 = '\0';
          }
        }
        iVar12 = (int)uVar23;
        if ((cVar21 != '\x03') && (iVar12 == 0)) goto LAB_001100fb;
        pcVar29[1] = **(char **)(&UNK_001502af + lVar26);
        uVar20 = (ulong)(uint)-iVar12;
        if (0 < iVar12) {
          uVar20 = uVar23;
        }
        pcVar29[2] = (char)(uVar23 >> 0x1f) * '\x02' + '+';
        if ((uint)uVar20 < 100) {
          pbVar24 = (byte *)(pcVar29 + 3);
        }
        else {
          uVar23 = uVar20 / 100;
          uVar20 = uVar20 % 100;
          pcVar29[3] = (char)uVar23 + '0';
          pbVar24 = (byte *)(pcVar29 + 4);
        }
        uVar10 = (ushort)uVar20 & 0xff;
        *pbVar24 = (byte)(uVar10 / 10) | 0x30;
        pbVar24[1] = (byte)(uVar10 % 10) | 0x30;
        iVar12 = (int)pbVar24 + 2;
      }
      uVar22 = iVar12 - (int)local_438;
      uVar23 = (ulong)uVar22;
      if (((bVar7) && (!bVar8)) &&
         (iVar12 = uVar27 - uVar22, iVar12 != 0 && (int)uVar22 <= (int)uVar27)) {
        lVar26 = (long)(int)uVar22;
        for (lVar30 = (long)(int)uVar27; iVar12 <= lVar30; lVar30 = lVar30 + -1) {
          local_438[lVar30] = local_438[lVar26];
          lVar26 = lVar26 + -1;
        }
        for (lVar30 = 0; uVar23 = (ulong)uVar27, iVar12 != (int)lVar30; lVar30 = lVar30 + 1) {
          local_438[lVar30 + uVar32] = '0';
        }
      }
      goto LAB_0011015d;
    case '\x05':
      uVar22 = ap->gp_offset;
      if ((ulong)uVar22 < 0x29) {
        puVar19 = (undefined8 *)((ulong)uVar22 + (long)ap->reg_save_area);
        ap->gp_offset = uVar22 + 8;
      }
      else {
        puVar19 = (undefined8 *)ap->overflow_arg_area;
        ap->overflow_arg_area = puVar19 + 1;
      }
      *(sxu32 *)*puVar19 = local_470;
      uVar27 = 0;
      uVar23 = 0;
      break;
    case '\x06':
      uVar14 = ap->gp_offset;
      if ((ulong)uVar14 < 0x29) {
        puVar19 = (undefined8 *)((ulong)uVar14 + (long)ap->reg_save_area);
        ap->gp_offset = uVar14 + 8;
      }
      else {
        puVar19 = (undefined8 *)ap->overflow_arg_area;
        ap->overflow_arg_area = puVar19 + 1;
      }
      pcVar29 = (char *)*puVar19;
      if (pcVar29 == (char *)0x0) {
        uVar23 = 1;
        pcVar29 = " ";
      }
      else {
        uVar14 = uVar22;
        if ((int)uVar22 < 0) {
          uVar14 = SyStrlen(pcVar29);
        }
        uVar23 = (ulong)uVar14;
        if ((int)uVar22 < (int)uVar14) {
          uVar23 = uVar32 & 0xffffffff;
        }
        if ((int)uVar22 < 0) {
          uVar23 = (ulong)uVar14;
        }
      }
    default:
switchD_0010f865_caseD_a:
      break;
    case '\a':
      local_438[0] = '%';
      goto LAB_0010f8a4;
    case '\b':
      uVar14 = ap->gp_offset;
      if ((ulong)uVar14 < 0x29) {
        pcVar29 = (char *)((ulong)uVar14 + (long)ap->reg_save_area);
        ap->gp_offset = uVar14 + 8;
      }
      else {
        pcVar29 = (char *)ap->overflow_arg_area;
        ap->overflow_arg_area = pcVar29 + 8;
      }
      local_438[0] = *pcVar29;
      uVar23 = 0x3d8;
      if ((int)uVar22 < 0x3d8) {
        uVar23 = uVar32 & 0xffffffff;
      }
      if ((int)uVar22 < 0) goto LAB_0010f8a4;
      for (uVar32 = 1; uVar32 < uVar23; uVar32 = uVar32 + 1) {
        local_438[uVar32] = local_438[0];
      }
LAB_0011015d:
      pcVar29 = local_438;
      break;
    case '\t':
switchD_0010f865_caseD_9:
      local_438[0] = '?';
      pcVar33 = pcVar33 + -(ulong)(iVar12 == 0);
LAB_0010f8a4:
      uVar23 = 1;
      pcVar29 = local_438;
      goto switchD_0010f865_caseD_a;
    case '\r':
      uVar22 = ap->gp_offset;
      if ((ulong)uVar22 < 0x29) {
        puVar19 = (undefined8 *)((ulong)uVar22 + (long)ap->reg_save_area);
        ap->gp_offset = uVar22 + 8;
      }
      else {
        puVar19 = (undefined8 *)ap->overflow_arg_area;
        ap->overflow_arg_area = puVar19 + 1;
      }
      puVar19 = (undefined8 *)*puVar19;
      if ((puVar19 == (undefined8 *)0x0) || (pcVar29 = (char *)*puVar19, pcVar29 == (char *)0x0)) {
        uVar23 = 1;
        pcVar29 = " ";
      }
      else {
        uVar23 = (ulong)*(uint *)(puVar19 + 1);
      }
    }
    uVar22 = (uint)uVar23;
    uVar27 = uVar27 - uVar22;
    if ((!bVar8) && (uVar14 = uVar27, 0 < (int)uVar27)) {
      for (; 0x31 < uVar14; uVar14 = uVar14 - 0x32) {
        sVar11 = FormatConsumer(InternFormat_spaces,0x32,&local_470);
        if (sVar11 != 0) goto LAB_001102d4;
      }
      if ((uVar14 != 0) &&
         (sVar11 = FormatConsumer(InternFormat_spaces,uVar14,&local_470), sVar11 != 0))
      goto LAB_001102d4;
    }
    if ((0 < (int)uVar22) && (sVar11 = FormatConsumer(pcVar29,uVar22,&local_470), sVar11 != 0))
    goto LAB_001102d4;
    if ((bVar8) && (0 < (int)uVar27)) {
      for (; 0x31 < uVar27; uVar27 = uVar27 - 0x32) {
        sVar11 = FormatConsumer(InternFormat_spaces,0x32,&local_470);
        if (sVar11 != 0) goto LAB_001102d4;
      }
      if ((uVar27 != 0) &&
         (sVar11 = FormatConsumer(InternFormat_spaces,uVar27,&local_470), sVar11 != 0))
      goto LAB_001102d4;
    }
    zFormat = pcVar33 + 1;
  }
  FormatConsumer("%",1,&local_470);
LAB_001102d4:
  if (local_450 != (sxu32 *)0x0) {
    *local_450 = local_470;
  }
  return local_468;
}

Assistant:

static sxi32 FormatMount(sxi32 nType, void *pConsumer, ProcConsumer xUserCons, void *pUserData, sxu32 *pOutLen, const char *zFormat, va_list ap)
{
	SyFmtConsumer sCons;
	sCons.nType = nType;
	sCons.rc = SXRET_OK;
	sCons.nLen = 0;
	if( pOutLen ){
		*pOutLen = 0;
	}
	switch(nType){
	case SXFMT_CONS_PROC:
#if defined(UNTRUST)
			if( xUserCons == 0 ){
				return SXERR_EMPTY;
			}
#endif
			sCons.uConsumer.sFunc.xUserConsumer = xUserCons;
			sCons.uConsumer.sFunc.pUserData	    = pUserData;
		break;
		case SXFMT_CONS_BLOB:
			sCons.uConsumer.pBlob = (SyBlob *)pConsumer;
			break;
		default: 
			return SXERR_UNKNOWN;
	}
	InternFormat(FormatConsumer, &sCons, zFormat, ap); 
	if( pOutLen ){
		*pOutLen = sCons.nLen;
	}
	return sCons.rc;
}